

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void zeroblobFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *psVar1;
  sqlite3_int64 sVar2;
  sqlite3 *db;
  i64 n;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  psVar1 = sqlite3_context_db_handle(context);
  sVar2 = sqlite3_value_int64(*argv);
  if (psVar1->aLimit[0] < sVar2) {
    sqlite3_result_error_toobig(context);
  }
  else {
    sqlite3_result_zeroblob(context,(int)sVar2);
  }
  return;
}

Assistant:

static void zeroblobFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  i64 n;
  sqlite3 *db = sqlite3_context_db_handle(context);
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  n = sqlite3_value_int64(argv[0]);
  testcase( n==db->aLimit[SQLITE_LIMIT_LENGTH] );
  testcase( n==db->aLimit[SQLITE_LIMIT_LENGTH]+1 );
  if( n>db->aLimit[SQLITE_LIMIT_LENGTH] ){
    sqlite3_result_error_toobig(context);
  }else{
    sqlite3_result_zeroblob(context, (int)n); /* IMP: R-00293-64994 */
  }
}